

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::ArrayFeatureType::InternalSwap
          (ArrayFeatureType *this,ArrayFeatureType *other)

{
  DefaultOptionalValueUnion DVar1;
  int iVar2;
  uint32 uVar3;
  ShapeFlexibilityUnion SVar4;
  
  google::protobuf::RepeatedField<long>::InternalSwap(&this->shape_,&other->shape_);
  iVar2 = this->datatype_;
  this->datatype_ = other->datatype_;
  other->datatype_ = iVar2;
  SVar4 = this->ShapeFlexibility_;
  this->ShapeFlexibility_ = other->ShapeFlexibility_;
  other->ShapeFlexibility_ = SVar4;
  uVar3 = this->_oneof_case_[0];
  this->_oneof_case_[0] = other->_oneof_case_[0];
  other->_oneof_case_[0] = uVar3;
  DVar1 = this->defaultOptionalValue_;
  this->defaultOptionalValue_ = other->defaultOptionalValue_;
  other->defaultOptionalValue_ = DVar1;
  uVar3 = this->_oneof_case_[1];
  this->_oneof_case_[1] = other->_oneof_case_[1];
  other->_oneof_case_[1] = uVar3;
  iVar2 = this->_cached_size_;
  this->_cached_size_ = other->_cached_size_;
  other->_cached_size_ = iVar2;
  return;
}

Assistant:

void ArrayFeatureType::InternalSwap(ArrayFeatureType* other) {
  shape_.InternalSwap(&other->shape_);
  std::swap(datatype_, other->datatype_);
  std::swap(ShapeFlexibility_, other->ShapeFlexibility_);
  std::swap(_oneof_case_[0], other->_oneof_case_[0]);
  std::swap(defaultOptionalValue_, other->defaultOptionalValue_);
  std::swap(_oneof_case_[1], other->_oneof_case_[1]);
  std::swap(_cached_size_, other->_cached_size_);
}